

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_replace *m)

{
  order order;
  bool bVar1;
  __uint32_t _Var2;
  pointer ppVar3;
  long in_RSI;
  order o;
  uint64_t timestamp;
  uint32_t quantity;
  uint64_t price;
  uint64_t order_id;
  side_type side;
  order_book *ob;
  iterator it;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *in_stack_fffffffffffffeb8;
  uint64_t in_stack_ffffffffffffff28;
  order_book *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff40;
  uint64_t in_stack_ffffffffffffff58;
  order_book *in_stack_ffffffffffffff60;
  undefined1 local_88 [48];
  uint64_t local_58;
  uint local_4c;
  ulong local_48;
  uint64_t local_40;
  side_type local_31;
  order_book *local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  ulong local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_18;
  long local_10;
  
  local_20 = (ulong)*(ushort *)(in_RSI + 1);
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find(in_stack_fffffffffffffeb8,(key_type *)0x146479);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar1 = std::__detail::operator!=(&local_18,&local_28);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x1464c2);
    local_30 = &ppVar3->second;
    local_31 = order_book::side(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_40 = *(uint64_t *)(local_10 + 0x13);
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 0x1f));
    local_48 = (ulong)_Var2;
    local_4c = __bswap_32(*(__uint32_t *)(local_10 + 0x1b));
    local_58 = itch50_timestamp(0x146550);
    helix::order::order((order *)local_88,local_40,local_48,(ulong)local_4c,local_31,local_58);
    order.id = local_88._0_8_;
    order.level = (price_level *)in_stack_ffffffffffffff40;
    order.price = local_88._8_8_;
    order.quantity = local_88._16_8_;
    order._32_8_ = local_88._24_8_;
    order.timestamp = local_88._32_8_;
    order_book::replace(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,order);
    order_book::set_timestamp(local_30,local_58);
    order_book::symbol_abi_cxx11_(local_30);
    make_ob_event((string *)local_88._32_8_,local_88._24_8_,(order_book *)local_88._16_8_,
                  (event_mask)((ulong)local_88._8_8_ >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)local_88._8_8_,(event *)local_88._0_8_);
    event::~event((event *)0x146660);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_replace* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;
        auto side = ob.side(m->OriginalOrderReferenceNumber);
        uint64_t order_id = m->NewOrderReferenceNumber;
        uint64_t price    = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        order o{order_id, price, quantity, side, timestamp};
        ob.replace(m->OriginalOrderReferenceNumber, std::move(o));
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}